

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

cmServerResponse * __thiscall
cmServerProtocol1::ProcessConfigure
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *cm;
  cmGlobalGenerator *gg;
  cmState *pcVar1;
  bool bVar2;
  int iVar3;
  cmFileMonitor *pcVar4;
  Value *pVVar5;
  char *pcVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_iterator cVar7;
  undefined1 local_1a0 [16];
  undefined1 local_190 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toWatchList;
  Value passedArgs;
  string sourceDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheArgs;
  string buildDir;
  string errorMessage;
  cmServerResponse local_c0;
  
  if (this->m_State == STATE_INACTIVE) {
    std::__cxx11::string::string
              ((string *)&passedArgs,"This instance is inactive.",(allocator *)local_1a0);
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&passedArgs);
    pVVar5 = &passedArgs;
    goto LAB_004279ab;
  }
  pcVar4 = cmServerProtocol::FileMonitor(&this->super_cmServerProtocol);
  cmFileMonitor::StopMonitoring(pcVar4);
  errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
  errorMessage._M_string_length = 0;
  errorMessage.field_2._M_local_buf[0] = '\0';
  cm = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
       super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
       super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
       super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  GeneratorInformation::SetupGenerator(&this->GeneratorInfo,cm,&errorMessage);
  if (errorMessage._M_string_length == 0) {
    std::__cxx11::string::string((string *)&passedArgs,"unused",(allocator *)local_1a0);
    __l._M_len = 1;
    __l._M_array = (iterator)&passedArgs;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&cacheArgs,__l,(allocator_type *)&sourceDir);
    std::__cxx11::string::~string((string *)&passedArgs);
    pVVar5 = Json::Value::operator[](&request->Data,&kCACHE_ARGUMENTS_KEY_abi_cxx11_);
    Json::Value::Value(&passedArgs,pVVar5);
    bVar2 = Json::Value::isNull(&passedArgs);
    if (!bVar2) {
      bVar2 = Json::Value::isString(&passedArgs);
      if (bVar2) {
        Json::Value::asString_abi_cxx11_((string *)local_1a0,&passedArgs);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheArgs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
      }
      else {
        bVar2 = Json::Value::isArray(&passedArgs);
        if (bVar2) {
          cVar7 = Json::Value::begin(&passedArgs);
          sourceDir._M_dataplus._M_p = (pointer)cVar7.super_ValueIteratorBase.current_._M_node;
          sourceDir._M_string_length._0_1_ = cVar7.super_ValueIteratorBase.isNull_;
          while( true ) {
            cVar7 = Json::Value::end(&passedArgs);
            local_1a0._0_8_ = cVar7.super_ValueIteratorBase.current_._M_node;
            local_1a0[8] = cVar7.super_ValueIteratorBase.isNull_;
            bVar2 = Json::ValueIteratorBase::operator!=
                              ((ValueIteratorBase *)&sourceDir,(SelfType *)local_1a0);
            if (!bVar2) break;
            pVVar5 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&sourceDir);
            bVar2 = Json::Value::isString(pVVar5);
            if (!bVar2) goto LAB_00427589;
            pVVar5 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&sourceDir);
            Json::Value::asString_abi_cxx11_((string *)local_1a0,pVVar5);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &cacheArgs,(string *)local_1a0);
            std::__cxx11::string::~string((string *)local_1a0);
            Json::ValueIteratorBase::increment((ValueIteratorBase *)&sourceDir);
          }
          goto LAB_004275cb;
        }
LAB_00427589:
        std::__cxx11::string::string
                  ((string *)local_1a0,
                   "cacheArguments must be unset, a string or an array of strings.",
                   (allocator *)&sourceDir);
        cmServerRequest::ReportError(&local_c0,request,(string *)local_1a0);
        cmServerResponse::~cmServerResponse(&local_c0);
      }
      std::__cxx11::string::~string((string *)local_1a0);
    }
LAB_004275cb:
    pcVar6 = cmake::GetHomeDirectory(cm);
    std::__cxx11::string::string((string *)&sourceDir,pcVar6,(allocator *)local_1a0);
    pcVar6 = cmake::GetHomeOutputDirectory(cm);
    std::__cxx11::string::string((string *)&buildDir,pcVar6,(allocator *)local_1a0);
    if (buildDir._M_string_length == 0) {
      std::__cxx11::string::string
                ((string *)local_1a0,"No build directory set via Handshake.",
                 (allocator *)&toWatchList);
      cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a0);
LAB_0042796b:
      std::__cxx11::string::~string((string *)local_1a0);
    }
    else {
      gg = cm->GlobalGenerator;
      bVar2 = cmake::LoadCache(cm,&buildDir);
      if (!bVar2) {
        if (CONCAT71(sourceDir._M_string_length._1_7_,(undefined1)sourceDir._M_string_length) != 0)
        goto LAB_0042778b;
        std::__cxx11::string::string
                  ((string *)local_1a0,
                   "No sourceDirectory set via setGlobalSettings and no cache found in buildDirectory."
                   ,(allocator *)&toWatchList);
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a0);
        goto LAB_0042796b;
      }
      pcVar1 = cm->State;
      std::__cxx11::string::string
                ((string *)local_1a0,"CMAKE_HOME_DIRECTORY",(allocator *)&toWatchList);
      pcVar6 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      if (pcVar6 == (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)local_1a0,"No CMAKE_HOME_DIRECTORY found in cache.",
                   (allocator *)&toWatchList);
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a0);
        goto LAB_0042796b;
      }
      if (CONCAT71(sourceDir._M_string_length._1_7_,(undefined1)sourceDir._M_string_length) == 0) {
        std::__cxx11::string::string((string *)local_1a0,pcVar6,(allocator *)&toWatchList);
        std::__cxx11::string::operator=((string *)&sourceDir,(string *)local_1a0);
        std::__cxx11::string::~string((string *)local_1a0);
        cmake::SetHomeDirectory(cm,&sourceDir);
      }
      pcVar1 = cm->State;
      std::__cxx11::string::string((string *)local_1a0,"CMAKE_GENERATOR",(allocator *)&toWatchList);
      pcVar6 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      if (gg != (cmGlobalGenerator *)0x0 && pcVar6 != (char *)0x0) {
        (*gg->_vptr_cmGlobalGenerator[3])(local_1a0,gg);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1a0,pcVar6);
        std::__cxx11::string::~string((string *)local_1a0);
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)local_1a0,
                     "Configured generator does not match with CMAKE_GENERATOR found in cache.",
                     (allocator *)&toWatchList);
          cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a0);
          goto LAB_0042796b;
        }
      }
LAB_0042778b:
      cmSystemTools::s_FatalErrorOccured = false;
      cmSystemTools::s_ErrorOccured = false;
      iVar3 = cmake::AddCMakePaths(cm);
      if (iVar3 != 1) {
        std::__cxx11::string::string
                  ((string *)local_1a0,"Failed to set CMake paths.",(allocator *)&toWatchList);
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a0);
        goto LAB_0042796b;
      }
      bVar2 = cmake::SetCacheArgs(cm,&cacheArgs);
      if (!bVar2) {
        std::__cxx11::string::string
                  ((string *)local_1a0,"cacheArguments could not be set.",(allocator *)&toWatchList)
        ;
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a0);
        goto LAB_0042796b;
      }
      iVar3 = cmake::Configure(cm);
      if (iVar3 < 0) {
        std::__cxx11::string::string
                  ((string *)local_1a0,"Configuration failed.",(allocator *)&toWatchList);
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a0);
        goto LAB_0042796b;
      }
      toWatchList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      toWatchList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      toWatchList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a0._0_8_ = local_190;
      local_1a0._8_8_ = 0;
      local_190._0_8_ = local_190._0_8_ & 0xffffffffffffff00;
      anon_unknown.dwarf_b9b256::getCMakeInputs
                (gg,(string *)local_1a0,&buildDir,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0,&toWatchList,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      std::__cxx11::string::~string((string *)local_1a0);
      pcVar4 = cmServerProtocol::FileMonitor(&this->super_cmServerProtocol);
      local_1a0._8_8_ = 0;
      local_190._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1101:31)>
           ::_M_invoke;
      local_190._0_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1101:31)>
           ::_M_manager;
      local_1a0._0_8_ = this;
      cmFileMonitor::MonitorPaths(pcVar4,&toWatchList,(Callback *)local_1a0);
      std::_Function_base::~_Function_base((_Function_base *)local_1a0);
      this->m_State = STATE_CONFIGURED;
      this->m_isDirty = false;
      Json::Value::Value((Value *)local_1a0,nullValue);
      cmServerRequest::Reply(__return_storage_ptr__,request,(Value *)local_1a0);
      Json::Value::~Value((Value *)local_1a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&toWatchList);
    }
    std::__cxx11::string::~string((string *)&buildDir);
    std::__cxx11::string::~string((string *)&sourceDir);
    Json::Value::~Value(&passedArgs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cacheArgs);
  }
  else {
    cmServerRequest::ReportError(__return_storage_ptr__,request,&errorMessage);
  }
  pVVar5 = (Value *)&errorMessage;
LAB_004279ab:
  std::__cxx11::string::~string((string *)pVVar5);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessConfigure(
  const cmServerRequest& request)
{
  if (this->m_State == STATE_INACTIVE) {
    return request.ReportError("This instance is inactive.");
  }

  FileMonitor()->StopMonitoring();

  std::string errorMessage;
  cmake* cm = this->CMakeInstance();
  this->GeneratorInfo.SetupGenerator(cm, &errorMessage);
  if (!errorMessage.empty()) {
    return request.ReportError(errorMessage);
  }

  // Make sure the types of cacheArguments matches (if given):
  std::vector<std::string> cacheArgs = { "unused" };
  bool cacheArgumentsError = false;
  const Json::Value passedArgs = request.Data[kCACHE_ARGUMENTS_KEY];
  if (!passedArgs.isNull()) {
    if (passedArgs.isString()) {
      cacheArgs.push_back(passedArgs.asString());
    } else if (passedArgs.isArray()) {
      for (auto i = passedArgs.begin(); i != passedArgs.end(); ++i) {
        if (!i->isString()) {
          cacheArgumentsError = true;
          break;
        }
        cacheArgs.push_back(i->asString());
      }
    } else {
      cacheArgumentsError = true;
    }
  }
  if (cacheArgumentsError) {
    request.ReportError(
      "cacheArguments must be unset, a string or an array of strings.");
  }

  std::string sourceDir = cm->GetHomeDirectory();
  const std::string buildDir = cm->GetHomeOutputDirectory();

  cmGlobalGenerator* gg = cm->GetGlobalGenerator();

  if (buildDir.empty()) {
    return request.ReportError("No build directory set via Handshake.");
  }

  if (cm->LoadCache(buildDir)) {
    // build directory has been set up before
    const char* cachedSourceDir =
      cm->GetState()->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    if (!cachedSourceDir) {
      return request.ReportError("No CMAKE_HOME_DIRECTORY found in cache.");
    }
    if (sourceDir.empty()) {
      sourceDir = std::string(cachedSourceDir);
      cm->SetHomeDirectory(sourceDir);
    }

    const char* cachedGenerator =
      cm->GetState()->GetInitializedCacheValue("CMAKE_GENERATOR");
    if (cachedGenerator) {
      if (gg && gg->GetName() != cachedGenerator) {
        return request.ReportError("Configured generator does not match with "
                                   "CMAKE_GENERATOR found in cache.");
      }
    }
  } else {
    // build directory has not been set up before
    if (sourceDir.empty()) {
      return request.ReportError("No sourceDirectory set via "
                                 "setGlobalSettings and no cache found in "
                                 "buildDirectory.");
    }
  }

  cmSystemTools::ResetErrorOccuredFlag(); // Reset error state

  if (cm->AddCMakePaths() != 1) {
    return request.ReportError("Failed to set CMake paths.");
  }

  if (!cm->SetCacheArgs(cacheArgs)) {
    return request.ReportError("cacheArguments could not be set.");
  }

  int ret = cm->Configure();
  if (ret < 0) {
    return request.ReportError("Configuration failed.");
  }

  std::vector<std::string> toWatchList;
  getCMakeInputs(gg, std::string(), buildDir, nullptr, &toWatchList, nullptr);

  FileMonitor()->MonitorPaths(toWatchList,
                              [this](const std::string& p, int e, int s) {
                                this->HandleCMakeFileChanges(p, e, s);
                              });

  m_State = STATE_CONFIGURED;
  m_isDirty = false;
  return request.Reply(Json::Value());
}